

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O2

void __thiscall QMessageBoxPrivate::buttonClicked(QMessageBoxPrivate *this,QAbstractButton *button)

{
  QObject *pQVar1;
  DetailButton *this_00;
  Data *pDVar2;
  bool bVar3;
  char *pcVar4;
  QObject *pQVar5;
  char *pcVar6;
  
  pQVar1 = *(QObject **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  this_00 = this->detailsButton;
  if ((this_00 != (DetailButton *)0x0) &&
     (this_00 == (DetailButton *)button && this->detailsText != (QMessageBoxDetailsText *)0x0)) {
    DetailButton::setLabel
              (this_00,((this->detailsText->super_QWidget).data)->widget_attributes >> 0x10 &
                       HideLabel);
    QWidget::setHidden(&this->detailsText->super_QWidget,
                       (((this->detailsText->super_QWidget).data)->widget_attributes >> 0x10 & 1) ==
                       0);
    updateSize(this);
    return;
  }
  setClickedButton(this,button);
  bVar3 = QPointer::operator_cast_to_bool((QPointer *)&this->receiverToDisconnectOnClose);
  if (bVar3) {
    pDVar2 = (this->receiverToDisconnectOnClose).wp.d;
    pcVar6 = (this->signalToDisconnectOnClose).d.ptr;
    if (pcVar6 == (char *)0x0) {
      pcVar6 = (char *)&QByteArray::_empty;
    }
    if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
      pQVar5 = (QObject *)0x0;
    }
    else {
      pQVar5 = (this->receiverToDisconnectOnClose).wp.value;
    }
    pcVar4 = (this->memberToDisconnectOnClose).d.ptr;
    if (pcVar4 == (char *)0x0) {
      pcVar4 = (char *)&QByteArray::_empty;
    }
    QObject::disconnect(pQVar1,pcVar6,pQVar5,pcVar4);
    QWeakPointer<QObject>::assign<QObject>(&(this->receiverToDisconnectOnClose).wp,(QObject *)0x0);
  }
  QByteArray::clear();
  QByteArray::clear();
  return;
}

Assistant:

void QMessageBoxPrivate::buttonClicked(QAbstractButton *button)
{
    Q_Q(QMessageBox);
#if QT_CONFIG(textedit)
    if (detailsButton && detailsText && button == detailsButton) {
        detailsButton->setLabel(detailsText->isHidden() ? HideLabel : ShowLabel);
        detailsText->setHidden(!detailsText->isHidden());
        updateSize();
    } else
#endif
    {
        setClickedButton(button);

        if (receiverToDisconnectOnClose) {
            QObject::disconnect(q, signalToDisconnectOnClose, receiverToDisconnectOnClose,
                                memberToDisconnectOnClose);
            receiverToDisconnectOnClose = nullptr;
        }
        signalToDisconnectOnClose.clear();
        memberToDisconnectOnClose.clear();
    }
}